

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_TestMapFieldExtra *
upb_test_TestMapFieldExtra_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  upb_test_TestMapFieldExtra *ret;
  upb_Arena *arena_local;
  size_t size_local;
  char *buf_local;
  
  buf_local = (char *)upb_test_TestMapFieldExtra_new(arena);
  if ((upb_test_TestMapFieldExtra *)buf_local == (upb_test_TestMapFieldExtra *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,(upb_Message *)buf_local,&upb_0test__TestMapFieldExtra_msg_init,
                       (upb_ExtensionRegistry *)0x0,0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      buf_local = (char *)0x0;
    }
  }
  return (upb_test_TestMapFieldExtra *)buf_local;
}

Assistant:

UPB_INLINE upb_test_TestMapFieldExtra* upb_test_TestMapFieldExtra_parse(const char* buf, size_t size, upb_Arena* arena) {
  upb_test_TestMapFieldExtra* ret = upb_test_TestMapFieldExtra_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &upb_0test__TestMapFieldExtra_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}